

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorBase::GenerateMemberConstexprConstructor
          (FieldGeneratorBase *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Printer *pPVar1;
  bool bVar2;
  LogMessage *pLVar3;
  char *in_RCX;
  Sub *local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  undefined1 local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  Sub *local_140;
  Sub local_138;
  iterator local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58 [2];
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  FieldGeneratorBase *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldDescriptor::is_extension(this->field_);
  local_31 = 0;
  if (bVar2) {
    in_RCX = "!field_->is_extension()";
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field.cc"
               ,0x9a,"!field_->is_extension()");
    local_31 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  }
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  bVar2 = FieldDescriptor::is_repeated(this->field_);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_58,"$name$_{}");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_58[0]._M_len,local_58[0]._M_str);
  }
  else {
    local_189 = 1;
    local_140 = &local_138;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"default",&local_161);
    DefaultValue_abi_cxx11_
              (&local_188,(cpp *)this->options_,(Options *)this->field_,(FieldDescriptor *)in_RCX);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_138,&local_160,&local_188);
    local_189 = 0;
    local_80 = &local_138;
    local_78 = 1;
    v._M_len = 1;
    v._M_array = local_80;
    absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_70._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1a0,"$name$_{$default$}");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_70._M_allocated_capacity,local_70._8_8_,local_1a0._M_len,
                      local_1a0._M_str);
    local_1e0 = (Sub *)&local_80;
    do {
      local_1e0 = local_1e0 + -1;
      io::Printer::Sub::~Sub(local_1e0);
    } while (local_1e0 != &local_138);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  return;
}

Assistant:

void FieldGeneratorBase::GenerateMemberConstexprConstructor(
    io::Printer* p) const {
  ABSL_CHECK(!field_->is_extension());
  if (field_->is_repeated()) {
    p->Emit("$name$_{}");
  } else {
    p->Emit({{"default", DefaultValue(options_, field_)}},
            "$name$_{$default$}");
  }
}